

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O3

double __thiscall sector_t::FindLowestFloorSurrounding(sector_t *this,vertex_t **v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ushort uVar4;
  line_t *plVar5;
  vertex_t *pvVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  vertex_t *pvVar13;
  ulong uVar14;
  sector_t *psVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  uVar4 = this->linecount;
  if ((ulong)uVar4 != 0) {
    pvVar13 = (*this->lines)->v1;
    dVar1 = (this->floorplane).D;
    dVar7 = (this->floorplane).normal.X;
    dVar8 = (this->floorplane).normal.Y;
    dVar2 = (this->floorplane).negiC;
    dVar16 = ((pvVar13->p).Y * dVar8 + dVar1 + (pvVar13->p).X * dVar7) * dVar2;
    if (0 < (short)uVar4) {
      uVar14 = 0;
      do {
        plVar5 = this->lines[uVar14];
        if (((plVar5->flags & 4) != 0) &&
           (((psVar15 = plVar5->frontsector, psVar15 != this ||
             (psVar15 = plVar5->backsector, psVar15 != this)) && (psVar15 != (sector_t *)0x0)))) {
          pvVar6 = plVar5->v1;
          dVar3 = (psVar15->floorplane).D;
          dVar9 = (psVar15->floorplane).normal.X;
          dVar10 = (psVar15->floorplane).normal.Y;
          dVar11 = (pvVar6->p).X;
          dVar12 = (pvVar6->p).Y;
          dVar17 = (psVar15->floorplane).negiC;
          dVar18 = (dVar10 * dVar12 + dVar3 + dVar9 * dVar11) * dVar17;
          if ((dVar18 < dVar16) && (dVar18 < (dVar12 * dVar8 + dVar1 + dVar11 * dVar7) * dVar2)) {
            pvVar13 = pvVar6;
            dVar16 = dVar18;
          }
          pvVar6 = plVar5->v2;
          dVar11 = (pvVar6->p).X;
          dVar12 = (pvVar6->p).Y;
          dVar17 = dVar17 * (dVar10 * dVar12 + dVar3 + dVar9 * dVar11);
          if ((dVar17 < dVar16) && (dVar17 < (dVar12 * dVar8 + dVar1 + dVar11 * dVar7) * dVar2)) {
            pvVar13 = pvVar6;
            dVar16 = dVar17;
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar4 != uVar14);
    }
    if (v != (vertex_t **)0x0) {
      *v = pvVar13;
    }
    return dVar16;
  }
  return this->planes[0].TexZ;
}

Assistant:

double sector_t::FindLowestFloorSurrounding (vertex_t **v) const
{
	int i;
	sector_t *other;
	line_t *check;
	double floor;
	double ofloor;
	vertex_t *spot;

	if (linecount == 0) return GetPlaneTexZ(sector_t::floor);

	spot = lines[0]->v1;
	floor = floorplane.ZatPoint(spot);

	for (i = 0; i < linecount; i++)
	{
		check = lines[i];
		if (NULL != (other = getNextSector (check, this)))
		{
			ofloor = other->floorplane.ZatPoint (check->v1);
			if (ofloor < floor && ofloor < floorplane.ZatPoint (check->v1))
			{
				floor = ofloor;
				spot = check->v1;
			}
			ofloor = other->floorplane.ZatPoint (check->v2);
			if (ofloor < floor && ofloor < floorplane.ZatPoint (check->v2))
			{
				floor = ofloor;
				spot = check->v2;
			}
		}
	}
	if (v != NULL)
		*v = spot;
	return floor;
}